

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

void Abc_SuppGenFilter(Vec_Wrd_t *p,int nBits)

{
  word wVar1;
  int i;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  i = 0;
  uVar3 = 0;
  do {
    iVar2 = (int)uVar3;
    if (p->nSize <= i) {
      if (iVar2 <= p->nSize) {
        p->nSize = iVar2;
        return;
      }
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x276,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
    }
    wVar1 = Vec_WrdEntry(p,i);
    uVar4 = uVar3;
    if ((wVar1 & 1L << ((byte)nBits & 0x3f)) == 0) {
      if ((iVar2 < 0) || (p->nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      uVar4 = (ulong)(iVar2 + 1);
      p->pArray[uVar3] = wVar1;
    }
    i = i + 1;
    uVar3 = uVar4;
  } while( true );
}

Assistant:

void Abc_SuppGenFilter( Vec_Wrd_t * p, int nBits )
{
    word Ent;
    int i, k = 0;
    Vec_WrdForEachEntry( p, Ent, i )
        if ( ((Ent >> nBits) & 1) == 0 )
            Vec_WrdWriteEntry( p, k++, Ent );
    Vec_WrdShrink( p, k );
}